

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetEnumValueName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view enum_name,
          string_view enum_value_name)

{
  bool bVar1;
  uchar *puVar2;
  char *pcVar3;
  string_view input;
  AlphaNum local_118;
  AlphaNum local_e8;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  string result;
  undefined1 local_50 [8];
  string stripped;
  string_view enum_value_name_local;
  string_view enum_name_local;
  
  pcVar3 = enum_name._M_str;
  result.field_2._8_8_ = pcVar3;
  stripped.field_2._8_8_ = pcVar3;
  TryRemovePrefix_abi_cxx11_((string *)local_50,this,enum_name,enum_value_name);
  local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
  input._M_len = local_a8._8_8_;
  input._M_str = pcVar3;
  ShoutyToPascalCase_abi_cxx11_((string *)local_98,local_a8._0_8_,input);
  puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)local_98);
  bVar1 = absl::lts_20240722::ascii_isdigit(*puVar2);
  if (bVar1) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_e8,"_");
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_e8);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_98);
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumValueName(absl::string_view enum_name,
                             absl::string_view enum_value_name) {
  std::string stripped = TryRemovePrefix(enum_name, enum_value_name);
  std::string result = ShoutyToPascalCase(stripped);
  // Just in case we have an enum name of FOO and a value of FOO_2... make sure
  // the returned string is a valid identifier.
  if (absl::ascii_isdigit(result[0])) {
    return absl::StrCat("_", result);
  }
  return result;
}